

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O0

ion_status_t oafh_insert(ion_file_hashmap_t *hash_map,ion_key_t key,ion_value_t value)

{
  ion_status_t iVar1;
  char cVar2;
  int iVar3;
  char *__ptr;
  int record_size;
  ion_hash_bucket_t *item;
  int local_30;
  int count;
  int loc;
  ion_hash_t hash;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_file_hashmap_t *hash_map_local;
  
  iVar3 = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  local_30 = oafh_get_location(iVar3,hash_map->map_size);
  item._4_4_ = 0;
  iVar3 = (hash_map->super).record.key_size + (hash_map->super).record.value_size + 1;
  __ptr = (char *)malloc((long)iVar3);
  fseek((FILE *)hash_map->file,(long)(local_30 * iVar3),0);
  do {
    if (item._4_4_ == hash_map->map_size) {
      free(__ptr);
      hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,3);
      hash_map_local._4_4_ = 0;
LAB_0010c747:
      iVar1.count = hash_map_local._4_4_;
      iVar1._0_4_ = (int)hash_map_local;
      return iVar1;
    }
    fread(__ptr,(long)iVar3,1,(FILE *)hash_map->file);
    if (*__ptr == -3) {
      cVar2 = (*(hash_map->super).compare)(__ptr + 1,key,(hash_map->super).record.key_size);
      if (cVar2 == '\0') {
        if (hash_map->write_concern == '\x01') {
          free(__ptr);
          hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,2);
          hash_map_local._4_4_ = 0;
        }
        else if (hash_map->write_concern == '\0') {
          fseek((FILE *)hash_map->file,(long)(((hash_map->super).record.key_size + 1) - iVar3),1);
          fwrite(value,(long)(hash_map->super).record.value_size,1,(FILE *)hash_map->file);
          free(__ptr);
          hash_map_local._0_4_ = (uint)hash_map_local._1_3_ << 8;
          hash_map_local._4_4_ = 1;
        }
        else {
          free(__ptr);
          hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,7);
          hash_map_local._4_4_ = 0;
        }
        goto LAB_0010c747;
      }
    }
    else if ((*__ptr == -1) || (*__ptr == -2)) {
      fseek((FILE *)hash_map->file,(long)-iVar3,1);
      *__ptr = -3;
      memcpy(__ptr + 1,key,(long)(hash_map->super).record.key_size);
      memcpy(__ptr + (long)(hash_map->super).record.key_size + 1,value,
             (long)(hash_map->super).record.value_size);
      fwrite(__ptr,(long)iVar3,1,(FILE *)hash_map->file);
      free(__ptr);
      hash_map_local._0_4_ = (uint)hash_map_local._1_3_ << 8;
      hash_map_local._4_4_ = 1;
      goto LAB_0010c747;
    }
    local_30 = local_30 + 1;
    if (hash_map->map_size <= local_30) {
      local_30 = 0;
      rewind((FILE *)hash_map->file);
    }
    item._4_4_ = item._4_4_ + 1;
  } while( true );
}

Assistant:

ion_status_t
oafh_insert(
	ion_file_hashmap_t	*hash_map,
	ion_key_t			key,
	ion_value_t			value
) {
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);	/* compute hash value for given key */

	int loc			= oafh_get_location(hash, hash_map->map_size);

	/* Scan until find an empty location - oah_insert if found */
	int count		= 0;

	ion_hash_bucket_t *item;

	int record_size = hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS);

	item = malloc(record_size);

	/* set file position */
	fseek(hash_map->file, loc * record_size, SEEK_SET);

	while (count != hash_map->map_size) {
		fread(item, record_size, 1, hash_map->file);
#if ION_DEBUG
		DUMP((int) ftell(hash_map->file), "%i");
#endif

		if (item->status == ION_IN_USE) {
			/* if a cell is in use, need to key to */

			if (hash_map->super.compare(item->data, key, hash_map->super.record.key_size) == ION_IS_EQUAL) {
				if (hash_map->write_concern == wc_insert_unique) {
					/* allow unique entries only */
					free(item);
					return ION_STATUS_ERROR(err_duplicate_key);
				}
				else if (hash_map->write_concern == wc_update) {
					/* allows for values to be updated											// */
					/* backup and write */
					fseek(hash_map->file, SIZEOF(STATUS) + hash_map->super.record.key_size - record_size, SEEK_CUR);
#if ION_DEBUG
					DUMP((int) ftell(hash_map->file), "%i");
					DUMP(value, "%s");
#endif
					fwrite(value, hash_map->super.record.value_size, 1, hash_map->file);
					free(item);
					return ION_STATUS_OK(1);
				}
				else {
					free(item);
					return ION_STATUS_ERROR(err_file_write_error);	/* there is a configuration issue with write concern */
				}
			}
		}
		else if ((item->status == ION_EMPTY) || (item->status == ION_DELETED)) {
			/* problem is here with base types as it is just an array of data.  Need better way */
			/* printf("empty\n"); */
			fseek(hash_map->file, -record_size, SEEK_CUR);
#if ION_DEBUG
			DUMP((int) ftell(hash_map->file), "%i");
#endif
			item->status = ION_IN_USE;
			memcpy(item->data, key, (hash_map->super.record.key_size));
			memcpy(item->data + hash_map->super.record.key_size, value, (hash_map->super.record.value_size));
			fwrite(item, record_size, 1, hash_map->file);
			free(item);

			return ION_STATUS_OK(1);
		}

		loc++;

		if (loc >= hash_map->map_size) {
			/* Perform wrapping */
			loc = 0;
			/* rewind the file */
			frewind(hash_map->file);
		}

#if ION_DEBUG
		printf("checking location %i\n", loc);
#endif
		count++;
	}

#if ION_DEBUG
	printf("Hash table full.  Insert not done");
#endif
	free(item);
	return ION_STATUS_ERROR(err_max_capacity);
}